

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

CavsByColor *
Omega_h::separate_by_color
          (CavsByColor *__return_storage_ptr__,Cavs *cavs,LOs *old_elem_colors,LOs *new_elem_colors)

{
  int *piVar1;
  Alloc *this;
  Alloc *this_00;
  LO LVar2;
  undefined4 extraout_var;
  SeparationResult res;
  LOs local_110;
  LOs local_100;
  Cavs local_f0;
  SeparationResult local_b0;
  
  (__return_storage_ptr__->super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    LVar2 = Graph::nedges(&cavs->keys2old_elems);
    if (LVar2 == 0) {
      LVar2 = Graph::nedges(&cavs->keys2new_elems);
      if (LVar2 == 0) {
        return (CavsByColor *)CONCAT44(extraout_var,LVar2);
      }
    }
    local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         (cavs->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_f0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         (cavs->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
    local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         (cavs->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_f0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         (cavs->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
    local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         (cavs->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_f0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         (cavs->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
    local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         (cavs->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_f0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         (cavs->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
    local_100.write_.shared_alloc_.alloc = (old_elem_colors->write_).shared_alloc_.alloc;
    if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
        local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_100.write_.shared_alloc_.alloc =
             (Alloc *)((local_100.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_100.write_.shared_alloc_.alloc)->use_count =
             (local_100.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    this_00 = local_100.write_.shared_alloc_.alloc;
    local_100.write_.shared_alloc_.direct_ptr = (old_elem_colors->write_).shared_alloc_.direct_ptr;
    local_110.write_.shared_alloc_.alloc = (new_elem_colors->write_).shared_alloc_.alloc;
    if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
        local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_110.write_.shared_alloc_.alloc =
             (Alloc *)((local_110.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_110.write_.shared_alloc_.alloc)->use_count =
             (local_110.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    this = local_110.write_.shared_alloc_.alloc;
    local_110.write_.shared_alloc_.direct_ptr = (new_elem_colors->write_).shared_alloc_.direct_ptr;
    separate_by_color_once(&local_b0,&local_f0,&local_100,&local_110);
    if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
      piVar1 = &this->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this);
        operator_delete(this,0x48);
      }
    }
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      piVar1 = &this_00->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    Cavs::~Cavs(&local_f0);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
              (__return_storage_ptr__,&local_b0.separated);
    Graph::operator=(&cavs->keys2old_elems,&local_b0.remainder.keys2old_elems);
    Graph::operator=(&cavs->keys2new_elems,&local_b0.remainder.keys2new_elems);
    Cavs::~Cavs(&local_b0.remainder);
    Cavs::~Cavs(&local_b0.separated);
  } while( true );
}

Assistant:

static CavsByColor separate_by_color(
    Cavs cavs, LOs old_elem_colors, LOs new_elem_colors) {
  CavsByColor cavs_by_color;
  while (cavs.keys2old_elems.nedges() || cavs.keys2new_elems.nedges()) {
    auto res = separate_by_color_once(cavs, old_elem_colors, new_elem_colors);
    cavs_by_color.push_back(res.separated);
    cavs = res.remainder;
  }
  return cavs_by_color;
}